

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

BOOL FILEInitStdHandles(void)

{
  undefined1 *hObject;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    hObject = (undefined1 *)init_std_handle(&pStdIn,_stdin);
    if (hObject == &DAT_ffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012735c;
    }
    else {
      puVar1 = (undefined1 *)init_std_handle(&pStdOut,_stdout);
      if (puVar1 == &DAT_ffffffffffffffff) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012735c;
      }
      else {
        puVar2 = (undefined1 *)init_std_handle(&pStdErr,_stderr);
        if (puVar2 != &DAT_ffffffffffffffff) {
          return 1;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012735c;
        CloseHandle(hObject);
        hObject = puVar1;
      }
      CloseHandle(hObject);
    }
    pStdIn = &DAT_ffffffffffffffff;
    pStdOut = &DAT_ffffffffffffffff;
    pStdErr = &DAT_ffffffffffffffff;
    return 0;
  }
LAB_0012735c:
  abort();
}

Assistant:

BOOL FILEInitStdHandles(void)
{
    HANDLE stdin_handle;
    HANDLE stdout_handle;
    HANDLE stderr_handle;

    TRACE("creating handle objects for stdin, stdout, stderr\n");

    stdin_handle = init_std_handle(&pStdIn, stdin);
    if(INVALID_HANDLE_VALUE == stdin_handle)
    {
        ERROR("failed to create stdin handle\n");
        goto fail;
    }

    stdout_handle = init_std_handle(&pStdOut, stdout);
    if(INVALID_HANDLE_VALUE == stdout_handle)
    {
        ERROR("failed to create stdout handle\n");
        CloseHandle(stdin_handle);
        goto fail;
    }

    stderr_handle = init_std_handle(&pStdErr, stderr);
    if(INVALID_HANDLE_VALUE == stderr_handle)
    {
        ERROR("failed to create stderr handle\n");
        CloseHandle(stdin_handle);
        CloseHandle(stdout_handle);
        goto fail;
    }
    return TRUE;

fail:
    pStdIn = INVALID_HANDLE_VALUE;
    pStdOut = INVALID_HANDLE_VALUE;
    pStdErr = INVALID_HANDLE_VALUE;
    return FALSE;
}